

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O0

void __thiscall PosTaggerTest_Test_Test::~PosTaggerTest_Test_Test(PosTaggerTest_Test_Test *this)

{
  void *in_RDI;
  
  ~PosTaggerTest_Test_Test((PosTaggerTest_Test_Test *)0x1d1f88);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(PosTaggerTest, Test) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST1, res);
    string s;
    s << res;
    ASSERT_TRUE(s == ANS_TEST1);
  }
}